

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_version_manager.cpp
# Opt level: O1

idx_t __thiscall
duckdb::RowVersionManager::GetCommittedSelVector
          (RowVersionManager *this,transaction_t start_time,transaction_t transaction_id,
          idx_t vector_idx,SelectionVector *sel_vector,idx_t max_count)

{
  int iVar1;
  reference pvVar2;
  undefined4 extraout_var;
  optional_ptr<duckdb::ChunkInfo,_true> info;
  _Head_base<0UL,_duckdb::ChunkInfo_*,_false> local_38;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar1 == 0) {
    if (vector_idx <
        (ulong)((long)(this->vector_info).
                      super_vector<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>_>_>
                      .
                      super__Vector_base<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->vector_info).
                      super_vector<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>_>_>
                      .
                      super__Vector_base<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3)) {
      pvVar2 = vector<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_true>
               ::operator[](&this->vector_info,vector_idx);
      local_38._M_head_impl =
           (pvVar2->super_unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>_>).
           _M_t.super___uniq_ptr_impl<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>_>.
           _M_t.super__Tuple_impl<0UL,_duckdb::ChunkInfo_*,_std::default_delete<duckdb::ChunkInfo>_>
           .super__Head_base<0UL,_duckdb::ChunkInfo_*,_false>._M_head_impl;
    }
    else {
      local_38._M_head_impl = (ChunkInfo *)0x0;
    }
    if (local_38._M_head_impl != (ChunkInfo *)0x0) {
      optional_ptr<duckdb::ChunkInfo,_true>::CheckValid
                ((optional_ptr<duckdb::ChunkInfo,_true> *)&local_38);
      iVar1 = (*(local_38._M_head_impl)->_vptr_ChunkInfo[3])
                        (local_38._M_head_impl,start_time,transaction_id,sel_vector,max_count);
      max_count = CONCAT44(extraout_var,iVar1);
    }
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return max_count;
  }
  ::std::__throw_system_error(iVar1);
}

Assistant:

idx_t RowVersionManager::GetCommittedSelVector(transaction_t start_time, transaction_t transaction_id, idx_t vector_idx,
                                               SelectionVector &sel_vector, idx_t max_count) {
	lock_guard<mutex> l(version_lock);
	auto info = GetChunkInfo(vector_idx);
	if (!info) {
		return max_count;
	}
	return info->GetCommittedSelVector(start_time, transaction_id, sel_vector, max_count);
}